

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  code *pcVar1;
  long lVar2;
  FILE *__stream;
  char **__argv;
  int iVar3;
  uint uVar4;
  Process *pPVar5;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  char **in_RCX;
  char **ppcVar9;
  uint in_R8D;
  char *pcStack_90;
  undefined8 uStack_88;
  FILE *local_80;
  char *local_78;
  Process *local_70;
  int local_64;
  uint local_60;
  int err;
  int r;
  int i;
  char **args;
  int local_48;
  int stdinFds [2];
  int stderrFds [2];
  int stdoutFds [2];
  uint streams_local;
  char **argv_local;
  int argc_local;
  String *executable_local;
  Process *this_local;
  
  ppcVar9 = (char **)&uStack_88;
  local_70 = this;
  if (this->pid != 0) {
    pcStack_90 = (char *)0x11a251;
    pPVar5 = (Process *)__errno_location();
    pPVar5->fdStdOutRead = 0x16;
    this_local._7_1_ = 0;
    goto LAB_0011a571;
  }
  pcStack_90 = (char *)0x11a270;
  memset(stderrFds,0,8);
  pcStack_90 = (char *)0x11a280;
  memset(stdinFds,0,8);
  pcStack_90 = (char *)0x11a290;
  memset((void *)((long)&args + 4),0,8);
  if ((in_R8D & 1) == 0) {
LAB_0011a2b0:
    if ((in_R8D & 2) != 0) {
      pcStack_90 = (char *)0x11a2c4;
      iVar3 = pipe(stdinFds);
      if (iVar3 != 0) goto LAB_0011a511;
    }
    if ((in_R8D & 4) != 0) {
      pcStack_90 = (char *)0x11a2e4;
      iVar3 = pipe((int *)((long)&args + 4));
      if (iVar3 != 0) goto LAB_0011a511;
    }
    if ((__oflag == 0) || (_r = in_RCX, in_RCX[__oflag + -1] != (char *)0x0)) {
      argv_local._4_4_ = __oflag;
      if (__oflag == 0) {
        argv_local._4_4_ = 1;
      }
      lVar2 = -((long)argv_local._4_4_ * 8 + 0x17U & 0xfffffffffffffff0);
      ppcVar9 = (char **)((long)&uStack_88 + lVar2);
      ppcVar9[argv_local._4_4_] = (char *)0x0;
      for (err = 1; err < argv_local._4_4_; err = err + 1) {
        ppcVar9[err] = in_RCX[err];
      }
      _r = ppcVar9;
      *(undefined8 *)((long)&pcStack_90 + lVar2) = 0x11a38e;
      pcVar6 = String::operator_cast_to_char_((String *)__file);
      *_r = pcVar6;
    }
    ppcVar9[-1] = (char *)0x11a39d;
    local_60 = vfork();
    iVar3 = stderrFds[1];
    if (local_60 == 0xffffffff) {
      this_local._7_1_ = 0;
      pPVar5 = (Process *)(ulong)local_60;
    }
    else if (local_60 == 0) {
      if (stderrFds[1] != 0) {
        ppcVar9[-1] = (char *)0x11a41a;
        dup2(iVar3,1);
        ppcVar9[-1] = (char *)0x11a422;
        ::close(stderrFds[1]);
      }
      iVar3 = stdinFds[1];
      if (stdinFds[1] != 0) {
        ppcVar9[-1] = (char *)0x11a435;
        dup2(iVar3,2);
        ppcVar9[-1] = (char *)0x11a43d;
        ::close(stdinFds[1]);
      }
      iVar3 = args._4_4_;
      if (args._4_4_ != 0) {
        ppcVar9[-1] = (char *)0x11a44d;
        dup2(iVar3,0);
        ppcVar9[-1] = (char *)0x11a455;
        ::close(args._4_4_);
      }
      if (stderrFds[0] != 0) {
        ppcVar9[-1] = (char *)0x11a463;
        ::close(stderrFds[0]);
      }
      if (stdinFds[0] != 0) {
        ppcVar9[-1] = (char *)0x11a471;
        ::close(stdinFds[0]);
      }
      if (local_48 != 0) {
        ppcVar9[-1] = (char *)0x11a47f;
        ::close(local_48);
      }
      ppcVar9[-1] = (char *)0x11a488;
      pcVar6 = String::operator_cast_to_char_((String *)__file);
      __argv = _r;
      ppcVar9[-1] = (char *)0x11a494;
      iVar3 = execvp(pcVar6,__argv);
      if (iVar3 == -1) {
        local_80 = _stderr;
        ppcVar9[-1] = (char *)0x11a4b0;
        local_78 = String::operator_cast_to_char_((String *)__file);
        ppcVar9[-1] = (char *)0x11a4b9;
        piVar8 = __errno_location();
        iVar3 = *piVar8;
        ppcVar9[-1] = (char *)0x11a4c0;
        pcVar7 = strerror(iVar3);
        pcVar6 = local_78;
        __stream = local_80;
        ppcVar9[-1] = (char *)0x11a4d9;
        fprintf(__stream,"%s: %s\n",pcVar6,pcVar7);
        ppcVar9[-1] = (char *)0x11a4e3;
        _exit(1);
      }
      ppcVar9[-1] = (char *)0x11a504;
      uVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Process.cpp"
                            ,0x2a5,"false");
      pPVar5 = (Process *)(ulong)uVar4;
      if (uVar4 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_local._7_1_ = 0;
    }
    else {
      local_70->pid = local_60;
      if (stderrFds[1] != 0) {
        ppcVar9[-1] = (char *)0x11a3cd;
        ::close(stderrFds[1]);
      }
      if (stdinFds[1] != 0) {
        ppcVar9[-1] = (char *)0x11a3db;
        ::close(stdinFds[1]);
      }
      if (args._4_4_ != 0) {
        ppcVar9[-1] = (char *)0x11a3e9;
        ::close(args._4_4_);
      }
      local_70->fdStdOutRead = stderrFds[0];
      local_70->fdStdErrRead = stdinFds[0];
      local_70->fdStdInWrite = local_48;
      this_local._7_1_ = 1;
      pPVar5 = local_70;
    }
  }
  else {
    pcStack_90 = (char *)0x11a2a4;
    iVar3 = pipe(stderrFds);
    if (iVar3 == 0) goto LAB_0011a2b0;
LAB_0011a511:
    pcStack_90 = (char *)0x11a516;
    piVar8 = __errno_location();
    local_64 = *piVar8;
    if (stderrFds[0] != 0) {
      pcStack_90 = (char *)0x11a529;
      ::close(stderrFds[0]);
      pcStack_90 = (char *)0x11a531;
      ::close(stderrFds[1]);
    }
    if (stdinFds[0] != 0) {
      pcStack_90 = (char *)0x11a53f;
      ::close(stdinFds[0]);
      pcStack_90 = (char *)0x11a547;
      ::close(stdinFds[1]);
    }
    if (args._4_4_ != 0) {
      pcStack_90 = (char *)0x11a555;
      ::close(args._4_4_);
      pcStack_90 = (char *)0x11a55d;
      ::close(local_48);
    }
    uStack_88._4_4_ = local_64;
    pcStack_90 = (char *)0x11a568;
    pPVar5 = (Process *)__errno_location();
    pPVar5->fdStdOutRead = uStack_88._4_4_;
    this_local._7_1_ = 0;
  }
LAB_0011a571:
  return (int)CONCAT71((int7)((ulong)pPVar5 >> 8),this_local._7_1_);
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  // prepare argv of child
  const char** args;
  if (argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if (!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = executable;
  }

  // start process
  {
    int r = vfork();
    if (r == -1)
      return false;
    else if (r != 0) // parent
    {
      pid = r;

      if (stdoutFds[1])
        ::close(stdoutFds[1]);
      if (stderrFds[1])
        ::close(stderrFds[1]);
      if (stdinFds[0])
        ::close(stdinFds[0]);

      fdStdOutRead = stdoutFds[0];
      fdStdErrRead = stderrFds[0];
      fdStdInWrite = stdinFds[1];

      return true;
    }
    else // child
    {
      if (stdoutFds[1])
      {
        dup2(stdoutFds[1], STDOUT_FILENO);
        ::close(stdoutFds[1]);
      }
      if (stderrFds[1])
      {
        dup2(stderrFds[1], STDERR_FILENO);
        ::close(stderrFds[1]);
      }
      if (stdinFds[0])
      {
        dup2(stdinFds[0], STDIN_FILENO);
        ::close(stdinFds[0]);
      }

      if (stdoutFds[0])
        ::close(stdoutFds[0]);
      if (stderrFds[0])
        ::close(stderrFds[0]);
      if (stdinFds[1])
        ::close(stdinFds[1]);

      if (execvp(executable, (char* const*)args) == -1)
      {
        fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
        _exit(EXIT_FAILURE);
      }
      ASSERT(false); // unreachable
      return false;
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}